

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standalone_tests.c
# Opt level: O3

void C_A_T_C_H_T_E_S_T_12(void)

{
  long *plVar1;
  long lVar2;
  int *test2;
  AssertionHandler catchAssertionHandler;
  Test *test;
  long local_150;
  SourceLineInfo local_148;
  undefined1 local_138 [16];
  long *local_128;
  char *local_120;
  size_t sStack_118;
  long *local_110;
  AssertionHandler local_108 [58];
  char local_ce;
  long *local_c8;
  long local_c0 [2];
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_c0[0] = 0;
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x58;
  Catch::StringRef::StringRef(&local_40,"test == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_40,Normal);
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138._8_2_ = 0x101;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123c58;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_128 = local_c0;
  local_110 = &local_150;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x59;
  Catch::StringRef::StringRef(&local_50,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_50,Normal);
  lVar2 = local_c0[0];
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123c98;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = &local_150;
  local_128 = local_c0;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_c0[0] = 0;
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x5d;
  Catch::StringRef::StringRef(&local_60,"test == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_60,Normal);
  lVar2 = local_c0[0];
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123c58;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = &local_150;
  local_128 = local_c0;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x5e;
  Catch::StringRef::StringRef(&local_70,"test == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_70,Normal);
  lVar2 = local_c0[0];
  local_150 = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123c98;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = &local_150;
  local_128 = local_c0;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_150 = 0;
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x62;
  Catch::StringRef::StringRef(&local_80,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_80,Normal);
  lVar2 = local_150;
  plVar1 = local_c0 + 1;
  local_c0[1] = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123cd8;
  local_128 = &local_150;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = plVar1;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 99;
  Catch::StringRef::StringRef(&local_90,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_90,Normal);
  lVar2 = local_150;
  local_c0[1] = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123d18;
  local_128 = &local_150;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = plVar1;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_150 = 0;
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x67;
  Catch::StringRef::StringRef(&local_a0,"test2 == __null");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_a0,Normal);
  lVar2 = local_150;
  local_c0[1] = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123cd8;
  local_128 = &local_150;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = plVar1;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  local_138._0_8_ = "REQUIRE";
  local_138._8_8_ = 7;
  local_148.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/tests/standalone_tests.c"
  ;
  local_148.line = 0x68;
  Catch::StringRef::StringRef(&local_b0,"test2 == nullptr");
  Catch::AssertionHandler::AssertionHandler
            (local_108,(StringRef *)local_138,&local_148,local_b0,Normal);
  lVar2 = local_150;
  local_c0[1] = 0;
  Catch::StringRef::StringRef((StringRef *)&local_148,"==");
  local_138[9] = lVar2 == 0;
  local_138[8] = 1;
  local_138._0_8_ = &PTR_streamReconstructedExpression_00123d18;
  local_128 = &local_150;
  local_120 = local_148.file;
  sStack_118 = local_148.line;
  local_110 = plVar1;
  Catch::AssertionHandler::handleExpr((ITransientExpression *)local_108);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_138);
  Catch::AssertionHandler::complete();
  if (local_ce == '\0') {
    (**(code **)(*local_c8 + 0x70))();
  }
  return;
}

Assistant:

class Test
	{
		Test()
		{
		}
	}